

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O2

void icu_63::number::impl::enum_to_stem_string::groupingStrategy
               (UGroupingStrategy value,UnicodeString *sb)

{
  ConstChar16Ptr local_78;
  ConstChar16Ptr local_70;
  ConstChar16Ptr local_68;
  ConstChar16Ptr local_60;
  ConstChar16Ptr local_58 [11];
  
  switch(value) {
  case UNUM_GROUPING_OFF:
    local_58[0].p_ = L"group-off";
    UnicodeString::append(sb,local_58,-1);
    break;
  case UNUM_GROUPING_MIN2:
    local_60.p_ = L"group-min2";
    UnicodeString::append(sb,&local_60,-1);
    break;
  case UNUM_GROUPING_AUTO:
    local_68.p_ = L"group-auto";
    UnicodeString::append(sb,&local_68,-1);
    break;
  case UNUM_GROUPING_ON_ALIGNED:
    local_70.p_ = L"group-on-aligned";
    UnicodeString::append(sb,&local_70,-1);
    break;
  case UNUM_GROUPING_THOUSANDS:
    local_78.p_ = L"group-thousands";
    UnicodeString::append(sb,&local_78,-1);
  }
  return;
}

Assistant:

void enum_to_stem_string::groupingStrategy(UGroupingStrategy value, UnicodeString& sb) {
    switch (value) {
        case UNUM_GROUPING_OFF:
            sb.append(u"group-off", -1);
            break;
        case UNUM_GROUPING_MIN2:
            sb.append(u"group-min2", -1);
            break;
        case UNUM_GROUPING_AUTO:
            sb.append(u"group-auto", -1);
            break;
        case UNUM_GROUPING_ON_ALIGNED:
            sb.append(u"group-on-aligned", -1);
            break;
        case UNUM_GROUPING_THOUSANDS:
            sb.append(u"group-thousands", -1);
            break;
        default:
            U_ASSERT(false);
    }
}